

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::ExtensionSet::RegisterEnumExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               EnumValidityFunc *is_valid)

{
  LogMessage *other;
  undefined7 in_register_00000011;
  LogFinisher local_69;
  undefined1 local_68 [14];
  bool local_5a;
  code *local_58;
  undefined8 local_50;
  FieldDescriptor *local_48;
  
  if ((int)CONCAT71(in_register_00000011,type) != 0xe) {
    LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0xb4);
    other = LogMessage::operator<<
                      ((LogMessage *)local_68,
                       "CHECK failed: (type) == (WireFormatLite::TYPE_ENUM): ");
    LogFinisher::operator=(&local_69,other);
    LogMessage::~LogMessage((LogMessage *)local_68);
  }
  local_48 = (FieldDescriptor *)0x0;
  local_58 = CallNoArgValidityFunc;
  local_68._0_8_ = extendee;
  local_68._8_4_ = number;
  local_68[0xc] = type;
  local_68[0xd] = is_repeated;
  local_5a = is_packed;
  local_50 = is_valid;
  anon_unknown_26::Register((ExtensionInfo *)local_68);
  return;
}

Assistant:

void ExtensionSet::RegisterEnumExtension(const MessageLite* extendee,
                                         int number, FieldType type,
                                         bool is_repeated, bool is_packed,
                                         EnumValidityFunc* is_valid) {
  GOOGLE_CHECK_EQ(type, WireFormatLite::TYPE_ENUM);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  info.enum_validity_check.func = CallNoArgValidityFunc;
  // See comment in CallNoArgValidityFunc() about why we use a c-style cast.
  info.enum_validity_check.arg = (void*)is_valid;
  Register(info);
}